

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::GetBlock
          (TPZBlockDiagonal<std::complex<float>_> *this,int64_t i,
          TPZFMatrix<std::complex<float>_> *block)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar2 = (this->fBlockPos).fStore[i];
  lVar5 = (long)(this->fBlockSize).fStore[i];
  (*(block->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(block,lVar5,lVar5);
  if (0 < lVar5) {
    lVar2 = lVar2 << 3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      lVar3 = lVar2;
      do {
        lVar1 = (block->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar4) ||
           ((block->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        block->fElem[lVar1 * lVar6 + lVar4]._M_value =
             *(_ComplexT *)((long)&((this->fStorage).fStore)->_M_value + lVar3);
        lVar6 = lVar6 + 1;
        lVar3 = lVar3 + lVar5 * 8;
      } while (lVar5 != lVar6);
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar4 != lVar5);
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::GetBlock(int64_t i, TPZFMatrix<TVar> &block){
    int64_t firstpos = fBlockPos[i];
    int64_t bsize = fBlockSize[i];
    block.Redim(bsize,bsize);
    int64_t r,c;
    for(r=0; r<bsize; r++) {
        for(c=0; c<bsize; c++) {
            block(r,c) = fStorage[firstpos+r+bsize*c];
        }
    }
}